

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O0

Entry * __thiscall llvm::DWARFUnitIndex::getFromHash(DWARFUnitIndex *this,uint64_t S)

{
  ulong uVar1;
  type pEVar2;
  uint64_t uVar3;
  bool bVar4;
  uint64_t HP;
  uint64_t H;
  uint64_t Mask;
  uint64_t S_local;
  DWARFUnitIndex *this_local;
  
  uVar1 = (ulong)((this->Header).NumBuckets - 1);
  HP = S & uVar1;
  while( true ) {
    pEVar2 = std::
             unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
             ::operator[](&this->Rows,HP);
    uVar3 = Entry::getSignature(pEVar2);
    bVar4 = false;
    if (uVar3 != S) {
      pEVar2 = std::
               unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
               ::operator[](&this->Rows,HP);
      uVar3 = Entry::getSignature(pEVar2);
      bVar4 = uVar3 != 0;
    }
    if (!bVar4) break;
    HP = HP + (S >> 0x20 & uVar1 | 1) & uVar1;
  }
  pEVar2 = std::
           unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
           ::operator[](&this->Rows,HP);
  uVar3 = Entry::getSignature(pEVar2);
  if (uVar3 == S) {
    this_local = (DWARFUnitIndex *)
                 std::
                 unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 ::operator[](&this->Rows,HP);
  }
  else {
    this_local = (DWARFUnitIndex *)0x0;
  }
  return (Entry *)this_local;
}

Assistant:

const DWARFUnitIndex::Entry *DWARFUnitIndex::getFromHash(uint64_t S) const {
  uint64_t Mask = Header.NumBuckets - 1;

  auto H = S & Mask;
  auto HP = ((S >> 32) & Mask) | 1;
  while (Rows[H].getSignature() != S && Rows[H].getSignature() != 0)
    H = (H + HP) & Mask;

  if (Rows[H].getSignature() != S)
    return nullptr;

  return &Rows[H];
}